

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_3_2::Matrix22<float>::Matrix22(Matrix22<float> *this,float (*a) [2])

{
  float (*a_local) [2];
  Matrix22<float> *this_local;
  
  this->x[0][0] = (*a)[0];
  this->x[0][1] = (*a)[1];
  this->x[1][0] = a[1][0];
  this->x[1][1] = a[1][1];
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix22<T>::Matrix22 (
    const T a[2][2]) IMATH_NOEXCEPT
{
    // Function calls and aliasing issues can inhibit vectorization versus
    // straight assignment of data members, so instead of this:
    //     memcpy (x, a, sizeof (x));
    // we do this:
    x[0][0] = a[0][0];
    x[0][1] = a[0][1];
    x[1][0] = a[1][0];
    x[1][1] = a[1][1];
}